

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook>_> *
kj::_::
CopyConstructArray_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_kj::Maybe<kj::Own<capnp::ClientHook>_>_*,_true,_false>
::apply(Maybe<kj::Own<capnp::ClientHook>_> *pos,Maybe<kj::Own<capnp::ClientHook>_> *start,
       Maybe<kj::Own<capnp::ClientHook>_> *end)

{
  ClientHook *pCVar1;
  ExceptionGuard local_18;
  
  for (; start != end; start = start + 1) {
    pCVar1 = (start->ptr).ptr;
    (pos->ptr).disposer = (start->ptr).disposer;
    (pos->ptr).ptr = pCVar1;
    (start->ptr).ptr = (ClientHook *)0x0;
    pos = pos + 1;
  }
  local_18.start = pos;
  local_18.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }